

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchncnn.cpp
# Opt level: O2

void benchmark(char *comment,Mat *_in,Option *opt)

{
  double dVar1;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar3;
  int iVar4;
  int i;
  bool bVar5;
  double dVar6;
  double local_258;
  double local_250;
  double local_248;
  DataReaderFromEmpty dr;
  Extractor ex;
  Net net;
  Mat out;
  Mat in;
  char parampath [256];
  
  ncnn::Mat::Mat(&in,_in);
  ncnn::Mat::fill(&in,0.01);
  ncnn::UnlockedPoolAllocator::clear(&g_blob_pool_allocator);
  ncnn::PoolAllocator::clear(&g_workspace_pool_allocator);
  ncnn::Net::Net(&net);
  net.opt.lightmode = opt->lightmode;
  net.opt._1_3_ = *(undefined3 *)&opt->field_0x1;
  net.opt.num_threads = opt->num_threads;
  net.opt.blob_allocator._0_4_ = *(undefined4 *)&opt->blob_allocator;
  net.opt.blob_allocator._4_4_ = *(undefined4 *)((long)&opt->blob_allocator + 4);
  net.opt.workspace_allocator = opt->workspace_allocator;
  net.opt.openmp_blocktime = opt->openmp_blocktime;
  net.opt.use_winograd_convolution = opt->use_winograd_convolution;
  net.opt.use_sgemm_convolution = opt->use_sgemm_convolution;
  net.opt.use_int8_inference = opt->use_int8_inference;
  net.opt.use_vulkan_compute = opt->use_vulkan_compute;
  net.opt.use_bf16_storage = opt->use_bf16_storage;
  net.opt.use_fp16_packed = opt->use_fp16_packed;
  net.opt.use_fp16_storage = opt->use_fp16_storage;
  net.opt.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  net.opt.use_int8_packed = opt->use_int8_packed;
  net.opt.use_int8_storage = opt->use_int8_storage;
  net.opt.use_int8_arithmetic = opt->use_int8_arithmetic;
  net.opt.use_packing_layout = opt->use_packing_layout;
  net.opt.use_shader_pack8 = opt->use_shader_pack8;
  net.opt.use_subgroup_basic = opt->use_subgroup_basic;
  net.opt.use_subgroup_vote = opt->use_subgroup_vote;
  net.opt.use_subgroup_ballot = opt->use_subgroup_ballot;
  net.opt.use_subgroup_shuffle = opt->use_subgroup_shuffle;
  net.opt.use_image_storage = opt->use_image_storage;
  net.opt.use_tensor_storage = opt->use_tensor_storage;
  net.opt.use_weight_fp16_storage = opt->use_weight_fp16_storage;
  net.opt.flush_denormals = opt->flush_denormals;
  net.opt.use_local_pool_allocator = opt->use_local_pool_allocator;
  net.opt.use_reserved_1 = opt->use_reserved_1;
  net.opt.use_reserved_2 = opt->use_reserved_2;
  net.opt.use_reserved_3 = opt->use_reserved_3;
  net.opt.use_reserved_4 = opt->use_reserved_4;
  net.opt.use_reserved_5 = opt->use_reserved_5;
  net.opt.use_reserved_6 = opt->use_reserved_6;
  net.opt.use_reserved_7 = opt->use_reserved_7;
  net.opt.use_reserved_8 = opt->use_reserved_8;
  net.opt.use_reserved_9 = opt->use_reserved_9;
  net.opt.use_reserved_10 = opt->use_reserved_10;
  net.opt.use_reserved_11 = opt->use_reserved_11;
  sprintf(parampath,"%s.param",comment);
  ncnn::Net::load_param(&net,parampath);
  DataReaderFromEmpty::DataReaderFromEmpty(&dr);
  ncnn::Net::load_model(&net,&dr.super_DataReader);
  pvVar2 = ncnn::Net::input_names(&net);
  pvVar3 = ncnn::Net::output_names(&net);
  if (g_enable_cooling_down == true) {
    sleep(10);
  }
  out.cstep = 0;
  out.data = (void *)0x0;
  out.refcount._0_4_ = 0;
  out.refcount._4_4_ = 0;
  out.elemsize._0_4_ = 0;
  out._20_8_ = 0;
  out.allocator = (Allocator *)0x0;
  out.dims = 0;
  out.w = 0;
  out.h = 0;
  out.d = 0;
  out.c = 0;
  iVar4 = 8;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    ncnn::Net::create_extractor((Net *)&ex);
    ncnn::Extractor::input
              (&ex,*(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start,&in);
    ncnn::Extractor::extract
              (&ex,*(pvVar3->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start,&out,0);
    ncnn::Extractor::~Extractor(&ex);
  }
  local_248 = 0.0;
  local_258 = 1.79769313486232e+308;
  local_250 = -1.79769313486232e+308;
  for (iVar4 = 0; iVar4 < g_loop_count; iVar4 = iVar4 + 1) {
    dVar6 = ncnn::get_current_time();
    ncnn::Net::create_extractor((Net *)&ex);
    ncnn::Extractor::input
              (&ex,*(pvVar2->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start,&in);
    ncnn::Extractor::extract
              (&ex,*(pvVar3->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                    _M_impl.super__Vector_impl_data._M_start,&out,0);
    ncnn::Extractor::~Extractor(&ex);
    dVar1 = ncnn::get_current_time();
    dVar1 = dVar1 - dVar6;
    dVar6 = dVar1;
    if (local_258 <= dVar1) {
      dVar6 = local_258;
    }
    local_248 = local_248 + dVar1;
    if (dVar1 <= local_250) {
      dVar1 = local_250;
    }
    local_258 = dVar6;
    local_250 = dVar1;
  }
  fprintf(_stderr,"%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n",SUB84(local_258,0),local_250,
          local_248 / (double)g_loop_count,comment);
  ncnn::Mat::~Mat(&out);
  ncnn::DataReader::~DataReader(&dr.super_DataReader);
  ncnn::Net::~Net(&net);
  ncnn::Mat::~Mat(&in);
  return;
}

Assistant:

void benchmark(const char* comment, const ncnn::Mat& _in, const ncnn::Option& opt)
{
    ncnn::Mat in = _in;
    in.fill(0.01f);

    g_blob_pool_allocator.clear();
    g_workspace_pool_allocator.clear();

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        g_blob_vkallocator->clear();
        g_staging_vkallocator->clear();
    }
#endif // NCNN_VULKAN

    ncnn::Net net;

    net.opt = opt;

#if NCNN_VULKAN
    if (net.opt.use_vulkan_compute)
    {
        net.set_vulkan_device(g_vkdev);
    }
#endif // NCNN_VULKAN

#ifdef __EMSCRIPTEN__
#define MODEL_DIR "/working/"
#else
#define MODEL_DIR ""
#endif

    char parampath[256];
    sprintf(parampath, MODEL_DIR "%s.param", comment);
    net.load_param(parampath);

    DataReaderFromEmpty dr;
    net.load_model(dr);

    const std::vector<const char*>& input_names = net.input_names();
    const std::vector<const char*>& output_names = net.output_names();

    if (g_enable_cooling_down)
    {
        // sleep 10 seconds for cooling down SOC  :(
#ifdef _WIN32
        Sleep(10 * 1000);
#elif defined(__unix__) || defined(__APPLE__)
        sleep(10);
#elif _POSIX_TIMERS
        struct timespec ts;
        ts.tv_sec = 10;
        ts.tv_nsec = 0;
        nanosleep(&ts, &ts);
#else
        // TODO How to handle it ?
#endif
    }

    ncnn::Mat out;

    // warm up
    for (int i = 0; i < g_warmup_loop_count; i++)
    {
        ncnn::Extractor ex = net.create_extractor();
        ex.input(input_names[0], in);
        ex.extract(output_names[0], out);
    }

    double time_min = DBL_MAX;
    double time_max = -DBL_MAX;
    double time_avg = 0;

    for (int i = 0; i < g_loop_count; i++)
    {
        double start = ncnn::get_current_time();

        {
            ncnn::Extractor ex = net.create_extractor();
            ex.input(input_names[0], in);
            ex.extract(output_names[0], out);
        }

        double end = ncnn::get_current_time();

        double time = end - start;

        time_min = std::min(time_min, time);
        time_max = std::max(time_max, time);
        time_avg += time;
    }

    time_avg /= g_loop_count;

    fprintf(stderr, "%20s  min = %7.2f  max = %7.2f  avg = %7.2f\n", comment, time_min, time_max, time_avg);
}